

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O2

void __thiscall QGraphicsColorizeEffect::draw(QGraphicsColorizeEffect *this,QPainter *painter)

{
  long lVar1;
  double dVar2;
  bool bVar3;
  char cVar4;
  undefined8 *puVar5;
  long lVar6;
  undefined8 *puVar7;
  QPixmap *this_00;
  long in_FS_OFFSET;
  byte bVar8;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [8];
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined8 uStack_b0;
  undefined2 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  long local_28;
  
  bVar8 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  if ((*(byte *)(lVar1 + 0xb0) & 1) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QGraphicsEffect::drawSource(&this->super_QGraphicsEffect,painter);
      return;
    }
  }
  else {
    local_d0 = 0;
    bVar3 = QGraphicsEffect::sourceIsPixmap(&this->super_QGraphicsEffect);
    if (bVar3) {
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      local_c8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsEffect::sourcePixmap
                ((QGraphicsEffect *)local_c8,(CoordinateSystem)this,(QPoint *)0x1,
                 (PixmapPadMode)&local_d0);
      cVar4 = QPixmap::isNull();
      if (cVar4 == '\0') {
        dVar2 = (double)(int)((ulong)local_d0 >> 0x20);
        local_e8._8_4_ = SUB84(dVar2,0);
        local_e8._0_8_ = (double)(int)local_d0;
        local_e8._12_4_ = (int)((ulong)dVar2 >> 0x20);
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        (**(code **)(**(long **)(lVar1 + 0xa8) + 0x68))
                  (*(long **)(lVar1 + 0xa8),painter,local_e8,local_c8);
      }
      this_00 = (QPixmap *)local_c8;
    }
    else {
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsEffect::sourcePixmap
                ((QGraphicsEffect *)local_e8,(CoordinateSystem)this,(QPoint *)0x0,
                 (PixmapPadMode)&local_d0);
      cVar4 = QPixmap::isNull();
      if (cVar4 == '\0') {
        puVar5 = (undefined8 *)QPainter::worldTransform();
        puVar7 = &local_78;
        for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar7 = *puVar5;
          puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
          puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
        }
        puVar5 = &DAT_006531e0;
        puVar7 = (undefined8 *)local_c8;
        for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar7 = *puVar5;
          puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
          puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
        }
        local_80 = 0;
        QPainter::setWorldTransform((QTransform *)painter,SUB81(local_c8,0));
        dVar2 = (double)(int)((ulong)local_d0 >> 0x20);
        local_f8._8_4_ = SUB84(dVar2,0);
        local_f8._0_8_ = (double)(int)local_d0;
        local_f8._12_4_ = (int)((ulong)dVar2 >> 0x20);
        local_b8 = (undefined1 *)0x0;
        uStack_b0 = 0;
        local_c8 = (undefined1  [8])0x0;
        puStack_c0 = (undefined1 *)0x0;
        (**(code **)(**(long **)(lVar1 + 0xa8) + 0x68))
                  (*(long **)(lVar1 + 0xa8),painter,local_f8,local_e8,local_c8);
        QPainter::setWorldTransform((QTransform *)painter,SUB81(&local_78,0));
      }
      this_00 = (QPixmap *)local_e8;
    }
    QPixmap::~QPixmap(this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsColorizeEffect::draw(QPainter *painter)
{
    Q_D(QGraphicsColorizeEffect);

    if (!d->opaque) {
        drawSource(painter);
        return;
    }

    QPoint offset;
    if (sourceIsPixmap()) {
        // No point in drawing in device coordinates (pixmap will be scaled anyways).
        const QPixmap pixmap = sourcePixmap(Qt::LogicalCoordinates, &offset, NoPad);
        if (!pixmap.isNull())
            d->filter->draw(painter, offset, pixmap);

        return;
    }

    // Draw pixmap in deviceCoordinates to avoid pixmap scaling.
    const QPixmap pixmap = sourcePixmap(Qt::DeviceCoordinates, &offset);
    if (pixmap.isNull())
        return;

    QTransform restoreTransform = painter->worldTransform();
    painter->setWorldTransform(QTransform());
    d->filter->draw(painter, offset, pixmap);
    painter->setWorldTransform(restoreTransform);
}